

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_150 [8];
  Esperf esperf;
  undefined1 local_110 [8];
  Options options;
  char **argv_local;
  int argc_local;
  
  options._240_8_ = argv;
  Options::Options((Options *)local_110);
  iVar1 = Options::Parse((Options *)local_110,argc,(char **)options._240_8_);
  if (iVar1 == 0) {
    Esperf::Esperf((Esperf *)local_150,(Options *)local_110);
    Esperf::Run((Esperf *)local_150);
  }
  Options::~Options((Options *)local_110);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    // parse command line options_
    Options options;
    if (options.Parse(argc, argv) == EXIT_SUCCESS){
        // run esperf
        Esperf esperf(&options);
        esperf.Run();
    };

    return EXIT_SUCCESS;
}